

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_hom.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_hom::load(xr_level_hom *this,xr_reader *r)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong n;
  ulong uVar3;
  hom_poly *phVar4;
  size_t size;
  xr_reader *pxStack_18;
  uint32_t version;
  xr_reader *r_local;
  xr_level_hom *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar2 = xr_reader::r_chunk<unsigned_int>(r,0,(uint *)((long)&size + 4));
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_hom.cxx"
                  ,0x10,"void xray_re::xr_level_hom::load(xr_reader &)");
  }
  if (size._4_4_ == 0) {
    sVar2 = xr_reader::find_chunk(pxStack_18,1);
    if (sVar2 == 0 || sVar2 % 0x28 != 0) {
      __assert_fail("size && (size % sizeof(hom_poly) == 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_hom.cxx"
                    ,0x13,"void xray_re::xr_level_hom::load(xr_reader &)");
    }
    n = sVar2 / 0x28;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = n;
    uVar3 = SUB168(auVar1 * ZEXT816(0x28),0);
    if (SUB168(auVar1 * ZEXT816(0x28),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    phVar4 = (hom_poly *)operator_new__(uVar3);
    this->m_polys = phVar4;
    xr_reader::r_cseq<xray_re::hom_poly>(pxStack_18,n,this->m_polys);
    this->m_num_polys = (uint32_t)n;
    return;
  }
  __assert_fail("version == HOM_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_hom.cxx"
                ,0x11,"void xray_re::xr_level_hom::load(xr_reader &)");
}

Assistant:

void xr_level_hom::load(xr_reader& r)
{
	uint32_t version;
	if (!r.r_chunk(HOM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == HOM_VERSION);
	size_t size = r.find_chunk(HOM_CHUNK_POLYGONS);
	xr_assert(size && (size % sizeof(hom_poly) == 0));
	m_polys = new hom_poly[size /= sizeof(hom_poly)];
	r.r_cseq(size, m_polys);
	m_num_polys = uint32_t(size & UINT32_MAX);
}